

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cRGBA,cBGRA,bAdd>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  BYTE BVar1;
  byte bVar2;
  byte bVar3;
  EBlend EVar4;
  FSpecialColormap *pFVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  BYTE *pBVar9;
  long lVar10;
  uint uVar11;
  BYTE BVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  
  pFVar5 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_0063e370_caseD_0:
    if (0 < count) {
      pBVar9 = pin + 3;
      lVar6 = 0;
      do {
        BVar1 = *pBVar9;
        if (BVar1 != '\0') {
          iVar7 = (int)((uint)pBVar9[-3] * inf->alpha + (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10
          ;
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          pout[lVar6 * 4 + 2] = (BYTE)iVar7;
          iVar7 = (int)((uint)pBVar9[-2] * inf->alpha + (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10
          ;
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          pout[lVar6 * 4 + 1] = (BYTE)iVar7;
          iVar7 = (int)((uint)pBVar9[-1] * inf->alpha + (uint)pout[lVar6 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          pout[lVar6 * 4] = (BYTE)iVar7;
          pout[lVar6 * 4 + 3] = BVar1;
        }
        lVar6 = lVar6 + 1;
        pBVar9 = pBVar9 + step;
      } while (count != (int)lVar6);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_0063e370_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        pBVar9 = pin + 3;
        lVar6 = 0;
        do {
          BVar1 = *pBVar9;
          if (BVar1 != '\0') {
            uVar11 = (uint)pBVar9[-2] * 0x8f + (uint)pBVar9[-3] * 0x4d +
                     ((uint)pBVar9[-1] + (uint)pBVar9[-1] * 8) * 4 >> 0xc;
            iVar7 = (int)((uint)IcePalette[uVar11][0] * inf->alpha +
                         (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10;
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            pout[lVar6 * 4 + 2] = (BYTE)iVar7;
            iVar7 = (int)((uint)IcePalette[uVar11][1] * inf->alpha +
                         (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10;
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            pout[lVar6 * 4 + 1] = (BYTE)iVar7;
            iVar7 = (int)((uint)IcePalette[uVar11][2] * inf->alpha + (uint)pout[lVar6 * 4] * 0x10000
                         ) >> 0x10;
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            pout[lVar6 * 4] = (BYTE)iVar7;
            pout[lVar6 * 4 + 3] = BVar1;
          }
          lVar6 = lVar6 + 1;
          pBVar9 = pBVar9 + step;
        } while (count != (int)lVar6);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        pBVar9 = pin + 3;
        lVar6 = 0;
        do {
          BVar1 = *pBVar9;
          if (BVar1 != '\0') {
            iVar7 = inf->blendcolor[3];
            iVar8 = (int)(((uint)pBVar9[-3] * iVar7 + inf->blendcolor[0] >> 0x10 & 0xff) *
                          inf->alpha + (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10;
            if (0xfe < iVar8) {
              iVar8 = 0xff;
            }
            bVar2 = pBVar9[-2];
            iVar13 = inf->blendcolor[1];
            bVar3 = pBVar9[-1];
            iVar15 = inf->blendcolor[2];
            pout[lVar6 * 4 + 2] = (BYTE)iVar8;
            iVar8 = (int)(((uint)bVar2 * iVar7 + iVar13 >> 0x10 & 0xff) * inf->alpha +
                         (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10;
            if (0xfe < iVar8) {
              iVar8 = 0xff;
            }
            pout[lVar6 * 4 + 1] = (BYTE)iVar8;
            iVar7 = (int)(((uint)bVar3 * iVar7 + iVar15 >> 0x10 & 0xff) * inf->alpha +
                         (uint)pout[lVar6 * 4] * 0x10000) >> 0x10;
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            pout[lVar6 * 4] = (BYTE)iVar7;
            pout[lVar6 * 4 + 3] = BVar1;
          }
          lVar6 = lVar6 + 1;
          pBVar9 = pBVar9 + step;
        } while (count != (int)lVar6);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        pBVar9 = pin + 3;
        lVar6 = 0;
        do {
          BVar1 = *pBVar9;
          if (BVar1 != '\0') {
            iVar7 = (int)(((uint)pBVar9[-3] * inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                         (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10;
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            bVar2 = pBVar9[-2];
            iVar8 = inf->blendcolor[1];
            bVar3 = pBVar9[-1];
            iVar13 = inf->blendcolor[2];
            pout[lVar6 * 4 + 2] = (BYTE)iVar7;
            iVar7 = (int)(((uint)bVar2 * iVar8 >> 0x10 & 0xff) * inf->alpha +
                         (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10;
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            pout[lVar6 * 4 + 1] = (BYTE)iVar7;
            iVar7 = (int)(((uint)bVar3 * iVar13 >> 0x10 & 0xff) * inf->alpha +
                         (uint)pout[lVar6 * 4] * 0x10000) >> 0x10;
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            pout[lVar6 * 4] = (BYTE)iVar7;
            pout[lVar6 * 4 + 3] = BVar1;
          }
          lVar6 = lVar6 + 1;
          pBVar9 = pBVar9 + step;
        } while (count != (int)lVar6);
      }
      break;
    default:
      EVar4 = inf->blend;
      lVar6 = (long)EVar4;
      if (lVar6 < 0x21) {
        if ((BLEND_ICEMAP < EVar4) && (0 < count)) {
          iVar7 = 0x20 - EVar4;
          pBVar9 = pin + 3;
          lVar6 = 0;
          do {
            BVar1 = *pBVar9;
            if (BVar1 != '\0') {
              bVar2 = pBVar9[-1];
              iVar8 = ((uint)pBVar9[-2] * 0x8f + (uint)pBVar9[-3] * 0x4d +
                       ((uint)bVar2 + (uint)bVar2 * 8) * 4 >> 8) * (EVar4 + BLEND_MODULATE);
              iVar13 = (uint)pBVar9[-3] * iVar7 + iVar8;
              iVar15 = (uint)pBVar9[-2] * iVar7 + iVar8;
              iVar8 = (uint)bVar2 * iVar7 + iVar8;
              iVar13 = ((uint)((ulong)((long)iVar13 * 0x84210843) >> 0x24) - (iVar13 >> 0x1f) & 0xff
                       ) * inf->alpha + (uint)pout[lVar6 * 4 + 2] * 0x10000;
              BVar12 = (BYTE)((uint)iVar13 >> 0x10);
              if (0xfe < iVar13 >> 0x10) {
                BVar12 = 0xff;
              }
              pout[lVar6 * 4 + 2] = BVar12;
              iVar13 = ((uint)((ulong)((long)iVar15 * 0x84210843) >> 0x24) - (iVar15 >> 0x1f) & 0xff
                       ) * inf->alpha + (uint)pout[lVar6 * 4 + 1] * 0x10000;
              BVar12 = (BYTE)((uint)iVar13 >> 0x10);
              if (0xfe < iVar13 >> 0x10) {
                BVar12 = 0xff;
              }
              pout[lVar6 * 4 + 1] = BVar12;
              iVar8 = ((uint)((ulong)((long)iVar8 * 0x84210843) >> 0x24) - (iVar8 >> 0x1f) & 0xff) *
                      inf->alpha + (uint)pout[lVar6 * 4] * 0x10000;
              BVar12 = (BYTE)((uint)iVar8 >> 0x10);
              if (0xfe < iVar8 >> 0x10) {
                BVar12 = 0xff;
              }
              pout[lVar6 * 4] = BVar12;
              pout[lVar6 * 4 + 3] = BVar1;
            }
            lVar6 = lVar6 + 1;
            pBVar9 = pBVar9 + step;
          } while (count != (int)lVar6);
        }
      }
      else if (0 < count) {
        pBVar9 = pin + 3;
        lVar10 = 0;
        do {
          BVar1 = *pBVar9;
          if (BVar1 != '\0') {
            uVar14 = (ulong)((uint)pBVar9[-2] * 0x8f + (uint)pBVar9[-3] * 0x4d +
                             ((uint)pBVar9[-1] + (uint)pBVar9[-1] * 8) * 4 >> 8);
            iVar7 = (int)((uint)*(byte *)((long)pFVar5 + uVar14 * 4 + lVar6 * 0x518 + -0xa6fe) *
                          inf->alpha + (uint)pout[lVar10 * 4 + 2] * 0x10000) >> 0x10;
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            bVar2 = *(byte *)((long)pFVar5 + uVar14 * 4 + lVar6 * 0x518 + -0xa700);
            bVar3 = *(byte *)((long)pFVar5 + uVar14 * 4 + lVar6 * 0x518 + -0xa6ff);
            pout[lVar10 * 4 + 2] = (BYTE)iVar7;
            iVar7 = (int)((uint)bVar3 * inf->alpha + (uint)pout[lVar10 * 4 + 1] * 0x10000) >> 0x10;
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            pout[lVar10 * 4 + 1] = (BYTE)iVar7;
            iVar7 = (int)((uint)bVar2 * inf->alpha + (uint)pout[lVar10 * 4] * 0x10000) >> 0x10;
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            pout[lVar10 * 4] = (BYTE)iVar7;
            pout[lVar10 * 4 + 3] = BVar1;
          }
          lVar10 = lVar10 + 1;
          pBVar9 = pBVar9 + step;
        } while (count != (int)lVar10);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}